

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Flt::set(V2Flt *this,syVFlt *para)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float t;
  float r;
  float f;
  syVFlt *para_local;
  V2Flt *this_local;
  
  this->mode = (int)para->mode;
  fVar1 = calcfreq(para->cutoff / 128.0);
  fVar1 = fVar1 * this->inst->SRfclinfreq;
  fVar2 = para->reso / 128.0;
  if (this->mode < 6) {
    this->res = 1.0 - fVar2;
    this->cfreq = fVar1;
  }
  else {
    fVar1 = fVar1 * 0.25;
    fVar3 = 1.0 - fVar1;
    this->moogp = fVar1 * 0.8 * fVar3 + fVar1;
    this->moogf = (1.0 - this->moogp) - this->moogp;
    this->moogq = fVar2 * 4.0 * (fVar3 * 0.5 * (fVar3 * 5.6 * fVar3 + (1.0 - fVar3)) + 1.0);
  }
  return;
}

Assistant:

void set(const syVFlt *para)
    {
        mode = (int)para->mode;
        float f = calcfreq(para->cutoff / 128.0f) * inst->SRfclinfreq;
        float r = para->reso / 128.0f;

        if (mode < MOOGL)
        {
            COVER("VCF set regular");
            res = 1.0f - r;
            cfreq = f;
        }
        else
        {
            COVER("VCF set moog");

            // @@@BUG? V2 code for this part looks suspicious.
            f *= 0.25f;
            float t = 1.0f - f;

            moogp = f + 0.8f * f * t;
            moogf = 1.0f - moogp - moogp;
            moogq = 4.0f * r * (1.0f + 0.5f * t * (1.0f - t + 5.6f * t * t));
        }
    }